

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall
ON_MeshParameters::Internal_AccumulatePangolinParameters
          (ON_MeshParameters *this,ON_MeshParameters *pangolin_defaults,ON_SHA1 *sha1)

{
  double dVar1;
  
  if (pangolin_defaults->m_bEvaluatorBasedTessellation != this->m_bEvaluatorBasedTessellation) {
    ON_SHA1::AccumulateBool(sha1,this->m_bEvaluatorBasedTessellation);
  }
  if (pangolin_defaults->m_curve_tess_min_num_segments != this->m_curve_tess_min_num_segments) {
    ON_SHA1::AccumulateInteger32(sha1,this->m_curve_tess_min_num_segments);
  }
  dVar1 = this->m_curve_tess_angle_tol_in_degrees;
  if ((pangolin_defaults->m_curve_tess_angle_tol_in_degrees != dVar1) ||
     (NAN(pangolin_defaults->m_curve_tess_angle_tol_in_degrees) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  dVar1 = this->m_curve_tess_max_dist_between_points;
  if ((pangolin_defaults->m_curve_tess_max_dist_between_points != dVar1) ||
     (NAN(pangolin_defaults->m_curve_tess_max_dist_between_points) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  dVar1 = this->m_curve_tess_min_parametric_ratio;
  if ((pangolin_defaults->m_curve_tess_min_parametric_ratio != dVar1) ||
     (NAN(pangolin_defaults->m_curve_tess_min_parametric_ratio) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  dVar1 = this->m_surface_tess_angle_tol_in_degrees;
  if ((pangolin_defaults->m_surface_tess_angle_tol_in_degrees != dVar1) ||
     (NAN(pangolin_defaults->m_surface_tess_angle_tol_in_degrees) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  dVar1 = this->m_surface_tess_max_edge_length;
  if ((pangolin_defaults->m_surface_tess_max_edge_length != dVar1) ||
     (NAN(pangolin_defaults->m_surface_tess_max_edge_length) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  dVar1 = this->m_surface_tess_min_edge_length;
  if ((pangolin_defaults->m_surface_tess_min_edge_length != dVar1) ||
     (NAN(pangolin_defaults->m_surface_tess_min_edge_length) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  dVar1 = this->m_surface_tess_min_edge_length_ratio_uv;
  if ((pangolin_defaults->m_surface_tess_min_edge_length_ratio_uv != dVar1) ||
     (NAN(pangolin_defaults->m_surface_tess_min_edge_length_ratio_uv) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  dVar1 = this->m_surface_tess_max_aspect_ratio;
  if ((pangolin_defaults->m_surface_tess_max_aspect_ratio != dVar1) ||
     (NAN(pangolin_defaults->m_surface_tess_max_aspect_ratio) || NAN(dVar1))) {
    ON_SHA1::AccumulateDouble(sha1,dVar1);
  }
  if (pangolin_defaults->m_smoothing_passes == this->m_smoothing_passes) {
    return;
  }
  ON_SHA1::AccumulateInteger32(sha1,this->m_smoothing_passes);
  return;
}

Assistant:

void ON_MeshParameters::Internal_AccumulatePangolinParameters(
  const ON_MeshParameters & pangolin_defaults,
  ON_SHA1& sha1
) const
{
  // Pangolin parameters
  if (pangolin_defaults.m_bEvaluatorBasedTessellation != m_bEvaluatorBasedTessellation)
    sha1.AccumulateBool(m_bEvaluatorBasedTessellation);
  if (pangolin_defaults.m_curve_tess_min_num_segments != m_curve_tess_min_num_segments)
    sha1.AccumulateInteger32(m_curve_tess_min_num_segments);
  if (pangolin_defaults.m_curve_tess_angle_tol_in_degrees != m_curve_tess_angle_tol_in_degrees)
    sha1.AccumulateDouble(m_curve_tess_angle_tol_in_degrees);
  if (pangolin_defaults.m_curve_tess_max_dist_between_points != m_curve_tess_max_dist_between_points)
    sha1.AccumulateDouble(m_curve_tess_max_dist_between_points);
  if (pangolin_defaults.m_curve_tess_min_parametric_ratio != m_curve_tess_min_parametric_ratio)
    sha1.AccumulateDouble(m_curve_tess_min_parametric_ratio);
  if (pangolin_defaults.m_surface_tess_angle_tol_in_degrees != m_surface_tess_angle_tol_in_degrees)
    sha1.AccumulateDouble(m_surface_tess_angle_tol_in_degrees);
  if (pangolin_defaults.m_surface_tess_max_edge_length != m_surface_tess_max_edge_length)
    sha1.AccumulateDouble(m_surface_tess_max_edge_length);
  if (pangolin_defaults.m_surface_tess_min_edge_length != m_surface_tess_min_edge_length)
    sha1.AccumulateDouble(m_surface_tess_min_edge_length);
  if (pangolin_defaults.m_surface_tess_min_edge_length_ratio_uv != m_surface_tess_min_edge_length_ratio_uv)
    sha1.AccumulateDouble(m_surface_tess_min_edge_length_ratio_uv);
  if (pangolin_defaults.m_surface_tess_max_aspect_ratio != m_surface_tess_max_aspect_ratio)
    sha1.AccumulateDouble(m_surface_tess_max_aspect_ratio);
  if (pangolin_defaults.m_smoothing_passes != m_smoothing_passes)
    sha1.AccumulateInteger32(m_smoothing_passes);
}